

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.cpp
# Opt level: O0

void __thiscall
Connection_twoValidConnections_Test::~Connection_twoValidConnections_Test
          (Connection_twoValidConnections_Test *this)

{
  Connection_twoValidConnections_Test *this_local;
  
  ~Connection_twoValidConnections_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Connection, twoValidConnections)
{
    const std::string e =
        "<?xml version=\"1.0\" encoding=\"UTF-8\"?>\n"
        "<model xmlns=\"http://www.cellml.org/cellml/2.0#\">\n"
        "  <component name=\"component1\">\n"
        "    <variable name=\"variable1\"/>\n"
        "  </component>\n"
        "  <component name=\"component2\">\n"
        "    <variable name=\"variable2\"/>\n"
        "  </component>\n"
        "  <component name=\"component3\">\n"
        "    <variable name=\"variable3\"/>\n"
        "  </component>\n"
        "  <connection component_1=\"component1\" component_2=\"component2\">\n"
        "    <map_variables variable_1=\"variable1\" variable_2=\"variable2\"/>\n"
        "  </connection>\n"
        "  <connection component_1=\"component1\" component_2=\"component3\">\n"
        "    <map_variables variable_1=\"variable1\" variable_2=\"variable3\"/>\n"
        "  </connection>\n"
        "</model>\n";

    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr comp1 = libcellml::Component::create();
    libcellml::ComponentPtr comp2 = libcellml::Component::create();
    libcellml::ComponentPtr comp3 = libcellml::Component::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();
    libcellml::VariablePtr v2 = libcellml::Variable::create();
    libcellml::VariablePtr v3 = libcellml::Variable::create();
    comp1->setName("component1");
    comp2->setName("component2");
    comp3->setName("component3");
    v1->setName("variable1");
    v2->setName("variable2");
    v3->setName("variable3");
    comp1->addVariable(v1);
    comp2->addVariable(v2);
    comp3->addVariable(v3);
    m->addComponent(comp1);
    m->addComponent(comp2);
    m->addComponent(comp3);
    libcellml::Variable::addEquivalence(v1, v2);
    libcellml::Variable::addEquivalence(v1, v3);
    libcellml::PrinterPtr printer = libcellml::Printer::create();
    const std::string a = printer->printModel(m);
    EXPECT_EQ(e, a);
}